

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O1

void glu::drawFromVAOBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  VertexArray vao;
  ObjectWrapper local_48;
  
  iVar1 = (*context->_vptr_RenderContext[3])();
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  traits = objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var_00,iVar2),traits);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(local_48.m_object);
  drawFromBuffers(context,program,numVertexArrays,vertexArrays,primitives,callback);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(0);
  ObjectWrapper::~ObjectWrapper(&local_48);
  return;
}

Assistant:

void drawFromVAOBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&	gl		= context.getFunctions();
	VertexArray				vao		(context);

	gl.bindVertexArray(*vao);
	drawFromBuffers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	gl.bindVertexArray(0);
}